

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readclose.c
# Opt level: O1

int readclose_append(int fd,stralloc *sa,uint bufsize)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  int iVar4;
  
  iVar1 = stralloc_readyplus(sa,bufsize);
  iVar4 = -1;
  if (iVar1 != 0) {
    do {
      sVar2 = read(fd,sa->s + sa->len,(ulong)bufsize);
      iVar4 = (int)sVar2;
      if ((iVar4 != -1) || (piVar3 = __errno_location(), *piVar3 != error_intr)) {
        if (iVar4 < 1) goto LAB_0010572c;
        sa->len = sa->len + iVar4;
      }
      iVar1 = stralloc_readyplus(sa,bufsize);
    } while (iVar1 != 0);
    iVar4 = -1;
  }
LAB_0010572c:
  close(fd);
  return iVar4;
}

Assistant:

int readclose_append(int fd,stralloc *sa,unsigned int bufsize)
{
  int r;
  for (;;) {
    if (!stralloc_readyplus(sa,bufsize)) { close(fd); return -1; }
    r = read(fd,sa->s + sa->len,bufsize);
    if (r == -1) if (errno == error_intr) continue;
    if (r <= 0) { close(fd); return r; }
    sa->len += r;
  }
}